

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

wchar_t rd_monster_memory(void)

{
  bool bVar1;
  _Bool _Var2;
  int iVar3;
  char *message;
  monster_race *pmVar4;
  monster_race *race_1;
  monster_race *race;
  char local_98 [4];
  wchar_t i;
  char buf [128];
  uint16_t local_10;
  uint16_t local_e;
  wchar_t local_c;
  uint16_t ntheft;
  uint16_t nkill;
  
  rd_byte(&mflag_size);
  if (mflag_size < 3) {
    race._4_4_ = 1;
    while( true ) {
      pmVar4 = r_info;
      bVar1 = false;
      if (z_info != (angband_constants *)0x0) {
        bVar1 = race._4_4_ < (int)(uint)z_info->r_max;
      }
      if (!bVar1) break;
      r_info[race._4_4_].max_num = 'd';
      _Var2 = flag_has_dbg(pmVar4[race._4_4_].flags,0xb,1,"race->flags","RF_UNIQUE");
      if (_Var2) {
        pmVar4[race._4_4_].max_num = '\x01';
      }
      race._4_4_ = race._4_4_ + 1;
    }
    rd_string(local_98,0x80);
    while (iVar3 = strcmp(local_98,"No more monsters"), iVar3 != 0) {
      pmVar4 = lookup_monster(local_98);
      rd_u16b(&local_e);
      rd_u16b(&local_10);
      if (pmVar4 != (monster_race *)0x0) {
        l_list[pmVar4->ridx].pkills = local_e;
        _Var2 = flag_has_dbg(pmVar4->flags,0xb,1,"race->flags","RF_UNIQUE");
        if ((_Var2) && (local_e != 0)) {
          pmVar4->max_num = '\0';
        }
        l_list[pmVar4->ridx].thefts = local_10;
        rd_string(local_98,0x80);
      }
    }
    local_c = L'\0';
  }
  else {
    message = format("Too many (%u) monster temporary flags!",(ulong)mflag_size);
    note(message);
    local_c = L'\xffffffff';
  }
  return local_c;
}

Assistant:

int rd_monster_memory(void)
{
	uint16_t nkill, ntheft;
	char buf[128];
	int i;

	/* Monster temporary flags */
	rd_byte(&mflag_size);

	/* Incompatible save files */
	if (mflag_size > MFLAG_SIZE) {
	        note(format("Too many (%u) monster temporary flags!", mflag_size));
		return (-1);
	}

	/* Reset maximum numbers per level */
	for (i = 1; z_info && i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		race->max_num = 100;
		if (rf_has(race->flags, RF_UNIQUE))
			race->max_num = 1;
	}

	rd_string(buf, sizeof(buf));
	while (!streq(buf, "No more monsters")) {
		struct monster_race *race = lookup_monster(buf);

		/* Get the kill and theft counts, skip if monster invalid */
		rd_u16b(&nkill);
		rd_u16b(&ntheft);
		if (!race) continue;

		/* Store the kill count, ensure dead uniques stay dead */
		l_list[race->ridx].pkills = nkill;
		if (rf_has(race->flags, RF_UNIQUE) && nkill)
			race->max_num = 0;

		/* Store the theft count */
		l_list[race->ridx].thefts = ntheft;

		/* Look for the next monster */
		rd_string(buf, sizeof(buf));
	}

	return 0;
}